

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int arkLSSetMassLinearSolver(void *arkode_mem,SUNLinearSolver LS,SUNMatrix M,int time_dep)

{
  SUNLinearSolver_Type SVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  sunindextype sVar5;
  ARKLsMassMem arkls_mem_00;
  SUNMatrix p_Var6;
  int in_ECX;
  SUNMatrix in_RDX;
  SUNLinearSolver in_RSI;
  ARKodeMem in_RDI;
  int matrixbased;
  int iterative;
  SUNLinearSolver_Type LSType;
  int retval;
  ARKLsMassMem arkls_mem;
  ARKodeMem ark_mem;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  ARKodeMem in_stack_ffffffffffffff98;
  SUNLinearSolver in_stack_ffffffffffffffa0;
  double dVar7;
  bool local_51;
  uint local_c;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-1,"ARKLS","arkLSSetMassLinearSolver",
                    "Integrator memory is NULL.");
    local_c = 0xffffffff;
  }
  else if (in_RSI == (SUNLinearSolver)0x0) {
    arkProcessError(in_RDI,-3,"ARKLS","arkLSSetMassLinearSolver","LS must be non-NULL");
    local_c = 0xfffffffd;
  }
  else if ((in_RSI->ops->gettype == (_func_SUNLinearSolver_Type_SUNLinearSolver *)0x0) ||
          (in_RSI->ops->solve ==
           (_func_int_SUNLinearSolver_SUNMatrix_N_Vector_N_Vector_realtype *)0x0)) {
    arkProcessError(in_RDI,-3,"ARKLS","arkLSSetMassLinearSolver",
                    "LS object is missing a required operation");
    local_c = 0xfffffffd;
  }
  else {
    SVar1 = SUNLinSolGetType((SUNLinearSolver)0x114f2d3);
    uVar2 = (uint)(SVar1 != SUNLINEARSOLVER_DIRECT);
    local_51 = SVar1 != SUNLINEARSOLVER_ITERATIVE && SVar1 != SUNLINEARSOLVER_MATRIX_EMBEDDED;
    uVar3 = (uint)local_51;
    if ((in_RDI->tempv1->ops->nvconst == (_func_void_realtype_N_Vector *)0x0) ||
       (in_RDI->tempv1->ops->nvwrmsnorm == (_func_realtype_N_Vector_N_Vector *)0x0)) {
      arkProcessError(in_RDI,-3,"ARKLS","arkLSSetMassLinearSolver",
                      "A required vector operation is not implemented.");
      local_c = 0xfffffffd;
    }
    else if ((SVar1 == SUNLINEARSOLVER_MATRIX_EMBEDDED) && (in_RDX != (SUNMatrix)0x0)) {
      arkProcessError(in_RDI,-3,"ARKLS","arkLSSetMassLinearSolver",
                      "Incompatible inputs: matrix-embedded LS requires NULL matrix");
      local_c = 0xfffffffd;
    }
    else {
      if (uVar2 == 0) {
        if (in_RDX == (SUNMatrix)0x0) {
          arkProcessError(in_RDI,-3,"ARKLS","arkLSSetMassLinearSolver",
                          "Incompatible inputs: direct LS requires non-NULL matrix");
          return -3;
        }
      }
      else {
        if (in_RDI->tempv1->ops->nvgetlength == (_func_sunindextype_N_Vector *)0x0) {
          arkProcessError(in_RDI,-3,"ARKLS","arkLSSetLinearSolver",
                          "A required vector operation is not implemented.");
          return -3;
        }
        if (((uVar3 == 0) && (SVar1 != SUNLINEARSOLVER_MATRIX_EMBEDDED)) &&
           (in_RSI->ops->setatimes == (_func_int_SUNLinearSolver_void_ptr_SUNATimesFn *)0x0)) {
          arkProcessError(in_RDI,-3,"ARKLS","arkLSSetMassLinearSolver",
                          "Incompatible inputs: iterative LS must support ATimes routine");
          return -3;
        }
        if ((uVar3 != 0) && (in_RDX == (SUNMatrix)0x0)) {
          arkProcessError(in_RDI,-3,"ARKLS","arkLSSetMassLinearSolver",
                          "Incompatible inputs: matrix-iterative LS requires non-NULL matrix");
          return -3;
        }
      }
      if ((in_RDI->step_attachmasssol == (ARKTimestepAttachMasssolFn)0x0) ||
         (in_RDI->step_getmassmem == (ARKTimestepGetMassMemFn)0x0)) {
        arkProcessError(in_RDI,-3,"ARKLS","arkLSSetMassLinearSolver",
                        "Missing time step module or associated routines");
        local_c = 0xfffffffd;
      }
      else {
        arkls_mem_00 = (ARKLsMassMem)malloc(0xe8);
        if (arkls_mem_00 == (ARKLsMassMem)0x0) {
          arkProcessError(in_RDI,-4,"ARKLS","arkLSSetMassLinearSolver","A memory request failed.");
          local_c = 0xfffffffc;
        }
        else {
          memset(arkls_mem_00,0,0xe8);
          arkls_mem_00->LS = in_RSI;
          arkls_mem_00->iterative = uVar2;
          arkls_mem_00->matrixbased = uVar3;
          arkls_mem_00->time_dependent = in_ECX;
          arkls_mem_00->mass = (ARKLsMassFn)0x0;
          arkls_mem_00->M_data = (void *)0x0;
          arkls_mem_00->mtsetup = (ARKLsMassTimesSetupFn)0x0;
          arkls_mem_00->mtimes = (ARKLsMassTimesVecFn)0x0;
          arkls_mem_00->mt_data = (void *)0x0;
          arkls_mem_00->pset = (ARKLsMassPrecSetupFn)0x0;
          arkls_mem_00->psolve = (ARKLsMassPrecSolveFn)0x0;
          arkls_mem_00->pfree = (_func_int_ARKodeMem *)0x0;
          arkls_mem_00->P_data = in_RDI->user_data;
          arkLsInitializeMassCounters(arkls_mem_00);
          arkls_mem_00->eplifac = 0.05;
          arkls_mem_00->last_flag = 0;
          if ((in_RSI->ops->setatimes == (_func_int_SUNLinearSolver_void_ptr_SUNATimesFn *)0x0) ||
             (iVar4 = SUNLinSolSetATimes(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                                         (SUNATimesFn)
                                         CONCAT44(in_stack_ffffffffffffff94,
                                                  in_stack_ffffffffffffff90)), iVar4 == 0)) {
            if ((in_RSI->ops->setpreconditioner ==
                 (_func_int_SUNLinearSolver_void_ptr_SUNPSetupFn_SUNPSolveFn *)0x0) ||
               (iVar4 = SUNLinSolSetPreconditioner
                                  (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                                   (SUNPSetupFn)
                                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                   (SUNPSolveFn)
                                   CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)),
               iVar4 == 0)) {
              if (in_RDX != (SUNMatrix)0x0) {
                arkls_mem_00->M = in_RDX;
                if (uVar2 == 0) {
                  p_Var6 = SUNMatClone((SUNMatrix)
                                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                                      );
                  arkls_mem_00->M_lu = p_Var6;
                  if (arkls_mem_00->M_lu == (SUNMatrix)0x0) {
                    arkProcessError(in_RDI,-4,"ARKLS","arkLSSetMassLinearSolver",
                                    "A memory request failed.");
                    free(arkls_mem_00);
                    return -4;
                  }
                }
                else {
                  arkls_mem_00->M_lu = in_RDX;
                }
              }
              iVar4 = arkAllocVec(in_stack_ffffffffffffff98,
                                  (N_Vector)
                                  CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                  (N_Vector *)
                                  CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
              if (iVar4 == 0) {
                arkProcessError(in_RDI,-4,"ARKLS","arkLSSetMassLinearSolver",
                                "A memory request failed.");
                if (uVar2 == 0) {
                  SUNMatDestroy((SUNMatrix)0x114f86a);
                }
                free(arkls_mem_00);
                local_c = 0xfffffffc;
              }
              else {
                if (uVar2 != 0) {
                  sVar5 = N_VGetLength((N_Vector)0x114f8a2);
                  if (0.0 < (double)sVar5) {
                    sVar5 = N_VGetLength((N_Vector)0x114f8cb);
                    dVar7 = sqrt((double)sVar5);
                  }
                  else {
                    dVar7 = 0.0;
                  }
                  arkls_mem_00->nrmfac = dVar7;
                }
                local_c = (*in_RDI->step_attachmasssol)
                                    (in_RDI,arkLsMassInitialize,arkLsMassSetup,arkLsMTimes,
                                     arkLsMassSolve,arkLsMassFree,in_ECX,SVar1,arkls_mem_00);
                if (local_c == 0) {
                  local_c = 0;
                }
                else {
                  arkProcessError(in_RDI,(int)(ulong)local_c,"ARKLS","arkLSSetMassLinearSolver",
                                  "Failed to attach to time stepper module");
                  N_VDestroy((N_Vector)0x114f97c);
                  if (uVar2 == 0) {
                    SUNMatDestroy((SUNMatrix)0x114f991);
                  }
                  free(arkls_mem_00);
                }
              }
            }
            else {
              arkProcessError(in_RDI,-0xc,"ARKLS","arkLSSetMassLinearSolver",
                              "Error in calling SUNLinSolSetPreconditioner");
              free(arkls_mem_00);
              local_c = 0xfffffff4;
            }
          }
          else {
            arkProcessError(in_RDI,-0xc,"ARKLS","arkLSSetMassLinearSolver",
                            "Error in calling SUNLinSolSetATimes");
            free(arkls_mem_00);
            local_c = 0xfffffff4;
          }
        }
      }
    }
  }
  return local_c;
}

Assistant:

int arkLSSetMassLinearSolver(void *arkode_mem, SUNLinearSolver LS,
                             SUNMatrix M, booleantype time_dep)
{
  ARKodeMem            ark_mem;
  ARKLsMassMem         arkls_mem;
  int                  retval;
  SUNLinearSolver_Type LSType;
  booleantype          iterative;    /* is the solver iterative?    */
  booleantype          matrixbased;  /* is a matrix structure used? */

  /* Return immediately if either arkode_mem or LS inputs are NULL */
  if (arkode_mem == NULL) {
    arkProcessError(NULL, ARKLS_MEM_NULL, "ARKLS",
                    "arkLSSetMassLinearSolver",
                    MSG_LS_ARKMEM_NULL);
    return(ARKLS_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;

  if (LS == NULL) {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS",
                    "arkLSSetMassLinearSolver",
                    "LS must be non-NULL");
    return(ARKLS_ILL_INPUT);
  }

  /* Test if solver is compatible with LS interface */
  if ( (LS->ops->gettype == NULL) || (LS->ops->solve == NULL) ) {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS",
                   "arkLSSetMassLinearSolver",
                   "LS object is missing a required operation");
    return(ARKLS_ILL_INPUT);
  }

  /* Retrieve the LS type */
  LSType = SUNLinSolGetType(LS);

  /* Set flags based on LS type */
  iterative   = (LSType != SUNLINEARSOLVER_DIRECT);
  matrixbased = ((LSType != SUNLINEARSOLVER_ITERATIVE) &&
                 (LSType != SUNLINEARSOLVER_MATRIX_EMBEDDED));

  /* Test if vector is compatible with LS interface */
  if ( (ark_mem->tempv1->ops->nvconst == NULL) ||
       (ark_mem->tempv1->ops->nvwrmsnorm == NULL) ){
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS",
                    "arkLSSetMassLinearSolver", MSG_LS_BAD_NVECTOR);
    return(ARKLS_ILL_INPUT);
  }

  /* Ensure that M is NULL when LS is matrix-embedded */
  if ((LSType == SUNLINEARSOLVER_MATRIX_EMBEDDED) && (M != NULL)) {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS", "arkLSSetMassLinearSolver",
                    "Incompatible inputs: matrix-embedded LS requires NULL matrix");
    return(ARKLS_ILL_INPUT);
  }

  /* Check for compatible LS type, matrix and "atimes" support */
  if (iterative) {

    if (ark_mem->tempv1->ops->nvgetlength == NULL) {
      arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS",
                      "arkLSSetLinearSolver", MSG_LS_BAD_NVECTOR);
      return(ARKLS_ILL_INPUT);
    }

    if (!matrixbased && (LSType != SUNLINEARSOLVER_MATRIX_EMBEDDED) &&
        (LS->ops->setatimes == NULL)) {
      arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS", "arkLSSetMassLinearSolver",
                      "Incompatible inputs: iterative LS must support ATimes routine");
      return(ARKLS_ILL_INPUT);
    }

    if (matrixbased && (M == NULL)) {
      arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS", "arkLSSetMassLinearSolver",
                      "Incompatible inputs: matrix-iterative LS requires non-NULL matrix");
      return(ARKLS_ILL_INPUT);
    }

  } else if (M == NULL) {

    arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS", "arkLSSetMassLinearSolver",
                    "Incompatible inputs: direct LS requires non-NULL matrix");
    return(ARKLS_ILL_INPUT);

  }

  /* Test whether time stepper module is supplied, with required routines */
  if ( (ark_mem->step_attachmasssol == NULL) ||
       (ark_mem->step_getmassmem == NULL) ) {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS",
                    "arkLSSetMassLinearSolver",
                    "Missing time step module or associated routines");
    return(ARKLS_ILL_INPUT);
  }

  /* Allocate memory for ARKLsMemRec */
  arkls_mem = NULL;
  arkls_mem = (ARKLsMassMem) malloc(sizeof(struct ARKLsMassMemRec));
  if (arkls_mem == NULL) {
    arkProcessError(ark_mem, ARKLS_MEM_FAIL, "ARKLS",
                    "arkLSSetMassLinearSolver", MSG_LS_MEM_FAIL);
    return(ARKLS_MEM_FAIL);
  }
  memset(arkls_mem, 0, sizeof(struct ARKLsMassMemRec));

  /* set SUNLinearSolver pointer */
  arkls_mem->LS = LS;

  /* Linear solver type information */
  arkls_mem->iterative   = iterative;
  arkls_mem->matrixbased = matrixbased;

  /* Set flag indicating time-dependence */
  arkls_mem->time_dependent = time_dep;

  /* Set mass-matrix routines to NULL */
  arkls_mem->mass    = NULL;
  arkls_mem->M_data  = NULL;
  arkls_mem->mtsetup = NULL;
  arkls_mem->mtimes  = NULL;
  arkls_mem->mt_data = NULL;

  /* Set defaults for preconditioner-related fields */
  arkls_mem->pset   = NULL;
  arkls_mem->psolve = NULL;
  arkls_mem->pfree  = NULL;
  arkls_mem->P_data = ark_mem->user_data;

  /* Initialize counters */
  arkLsInitializeMassCounters(arkls_mem);

  /* Set default values for the rest of the LS parameters */
  arkls_mem->eplifac   = ARKLS_EPLIN;
  arkls_mem->last_flag = ARKLS_SUCCESS;

  /* If LS supports ATimes, attach ARKLs routine */
  if (LS->ops->setatimes) {
    retval = SUNLinSolSetATimes(LS, ark_mem, NULL);
    if (retval != SUNLS_SUCCESS) {
      arkProcessError(ark_mem, ARKLS_SUNLS_FAIL, "ARKLS",
                      "arkLSSetMassLinearSolver",
                      "Error in calling SUNLinSolSetATimes");
      free(arkls_mem); arkls_mem = NULL;
      return(ARKLS_SUNLS_FAIL);
    }
  }

  /* If LS supports preconditioning, initialize pset/psol to NULL */
  if (LS->ops->setpreconditioner) {
    retval = SUNLinSolSetPreconditioner(LS, ark_mem, NULL, NULL);
    if (retval != SUNLS_SUCCESS) {
      arkProcessError(ark_mem, ARKLS_SUNLS_FAIL, "ARKLS",
                      "arkLSSetMassLinearSolver",
                      "Error in calling SUNLinSolSetPreconditioner");
      free(arkls_mem); arkls_mem = NULL;
      return(ARKLS_SUNLS_FAIL);
    }
  }

  /* When using a non-NULL SUNMatrix object, store pointer to M and, for direct
     linear solvers, create M_lu to store the factorization of M */
  if (M != NULL) {
    arkls_mem->M = M;
    if (!iterative) {
      arkls_mem->M_lu = SUNMatClone(M);
      if (arkls_mem->M_lu == NULL) {
        arkProcessError(ark_mem, ARKLS_MEM_FAIL, "ARKLS",
                        "arkLSSetMassLinearSolver", MSG_LS_MEM_FAIL);
        free(arkls_mem); arkls_mem = NULL;
        return(ARKLS_MEM_FAIL);
      }
    } else {
      arkls_mem->M_lu = M;
    }
  }

  /* Allocate memory for x */
  if (!arkAllocVec(ark_mem, ark_mem->tempv1, &(arkls_mem->x))) {
    arkProcessError(ark_mem, ARKLS_MEM_FAIL, "ARKLS",
                    "arkLSSetMassLinearSolver", MSG_LS_MEM_FAIL);
    if (!iterative) SUNMatDestroy(arkls_mem->M_lu);
    free(arkls_mem); arkls_mem = NULL;
    return(ARKLS_MEM_FAIL);
  }

  /* For iterative LS, compute default norm conversion factor */
  if (iterative)
    arkls_mem->nrmfac = SUNRsqrt( N_VGetLength(arkls_mem->x) );

  /* Attach ARKLs interface to time stepper module */
  retval = ark_mem->step_attachmasssol(arkode_mem, arkLsMassInitialize,
                                       arkLsMassSetup, arkLsMTimes,
                                       arkLsMassSolve, arkLsMassFree,
                                       time_dep, LSType, arkls_mem);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, retval, "ARKLS", "arkLSSetMassLinearSolver",
                    "Failed to attach to time stepper module");
    N_VDestroy(arkls_mem->x);
    if (!iterative) SUNMatDestroy(arkls_mem->M_lu);
    free(arkls_mem); arkls_mem = NULL;
    return(retval);
  }

  return(ARKLS_SUCCESS);
}